

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

int __thiscall icu_63::UnicodeSet::remove(UnicodeSet *this,char *__filename)

{
  int in_EDX;
  int iVar1;
  UChar32 range [3];
  int local_14;
  int local_10;
  undefined4 local_c;
  
  iVar1 = (int)__filename;
  if (0x10fffe < iVar1) {
    iVar1 = 0x10ffff;
  }
  local_10 = 0x10ffff;
  if (in_EDX < 0x10ffff) {
    local_10 = in_EDX;
  }
  if (local_10 < 1) {
    local_10 = 0;
  }
  if (iVar1 <= local_10) {
    local_14 = 0;
    if (0 < iVar1) {
      local_14 = iVar1;
    }
    local_10 = local_10 + 1;
    local_c = 0x110000;
    retain(this,&local_14,2,'\x02');
  }
  return (int)this;
}

Assistant:

UnicodeSet& UnicodeSet::remove(UChar32 start, UChar32 end) {
    if (pinCodePoint(start) <= pinCodePoint(end)) {
        UChar32 range[3] = { start, end+1, UNICODESET_HIGH };
        retain(range, 2, 2);
    }
    return *this;
}